

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpectrumPlus3.cpp
# Opt level: O2

bool MatchBlock(uint8_t *pbInput_,uint8_t *pbMatch_,char *psczRules_)

{
  char cVar1;
  
code_r0x0017657c:
  cVar1 = *psczRules_;
  if (cVar1 != '\0') {
    psczRules_ = psczRules_ + 1;
    if (cVar1 == 'n') goto LAB_0017659b;
    if (cVar1 != 'o') goto code_r0x00176590;
    pbInput_ = pbInput_ + (*pbInput_ == *pbMatch_);
    goto LAB_001765ac;
  }
LAB_001765b1:
  return cVar1 == '\0';
code_r0x00176590:
  if (cVar1 == 'y') {
    if (*pbInput_ != *pbMatch_) goto LAB_001765b1;
LAB_0017659b:
    pbInput_ = pbInput_ + 1;
LAB_001765ac:
    pbMatch_ = pbMatch_ + 1;
  }
  goto code_r0x0017657c;
}

Assistant:

static bool MatchBlock(const uint8_t* pbInput_, const uint8_t* pbMatch_, const char* psczRules_)
{
    while (*psczRules_)
    {
        switch (*psczRules_++)
        {
            // Character must match
        case 'y':
            if (*pbInput_++ != *pbMatch_++)
                return false;
            break;

            // Character not expected to match
        case 'n':
            ++pbInput_;
            ++pbMatch_;
            break;

            // Skip optional input if matched
        case 'o':
            if (*pbInput_ == *pbMatch_++)
                ++pbInput_;
            break;
        }
    }

    // Fully matched
    return true;
}